

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpolation2d.cpp
# Opt level: O0

void save_data(vector<double,_std::allocator<double>_> *x,vector<double,_std::allocator<double>_> *y
              ,vector<double,_std::allocator<double>_> *data,string *name)

{
  undefined8 uVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  int local_238;
  int i;
  ostream local_228 [8];
  ofstream file;
  string *name_local;
  vector<double,_std::allocator<double>_> *data_local;
  vector<double,_std::allocator<double>_> *y_local;
  vector<double,_std::allocator<double>_> *x_local;
  
  std::ofstream::ofstream(local_228);
  uVar1 = std::__cxx11::string::append((char *)name);
  std::ofstream::open(local_228,uVar1,0x10);
  local_238 = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(x);
    if (sVar2 <= (ulong)(long)local_238) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](x,(long)local_238);
    poVar4 = (ostream *)std::ostream::operator<<(local_228,*pvVar3);
    poVar4 = std::operator<<(poVar4," ");
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](y,(long)local_238);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
    poVar4 = std::operator<<(poVar4," ");
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](data,(long)local_238);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_238 = local_238 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_228);
  return;
}

Assistant:

void save_data(std::vector<double> x, std::vector<double> y,
               std::vector<double> data, std::string name) {
  ofstream file;
  file.open(name.append(".dat"));
  for (int i = 0; i < x.size(); i++) {
    file << x[i] << " " << y[i] << " " << data[i] << std::endl;
  }
  file.close();
}